

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAcurv::VariablesQbIncrementPosition(ChNodeFEAcurv *this,double step)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined8 in_XMM0_Qb;
  ChVector<double> new_ryy_dt;
  ChVector<double> new_rxx_dt;
  ChVector<double> new_rzz_dt;
  ChVector<double> local_c8;
  double local_b0 [3];
  ChVector<double> *local_98;
  undefined8 local_90;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  double local_58;
  ChVector<double> local_48;
  ChVector<double> local_30;
  undefined1 auVar8 [64];
  
  local_78 = step;
  uStack_70 = in_XMM0_Qb;
  ChVariables::Get_qb((ChVectorRef *)&local_c8,
                      *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  local_b0[0] = local_c8.m_data[0];
  local_b0[1] = 1.48219693752374e-323;
  local_90 = 0;
  local_80 = local_c8.m_data[1];
  local_98 = &local_c8;
  if (2 < (long)local_c8.m_data[1]) {
    local_98 = &local_c8;
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              ((ChVector<double> *)local_68,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)local_b0,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)&local_48,
                        *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
    local_b0[0] = (double)((long)local_48.m_data[0] + 0x18);
    local_b0[1] = 1.48219693752374e-323;
    local_90 = 3;
    local_80 = local_48.m_data[1];
    local_98 = &local_48;
    if (5 < (long)local_48.m_data[1]) {
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_c8,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)local_b0,(type *)0x0);
      ChVariables::Get_qb((ChVectorRef *)&local_30,
                          *(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
      local_b0[0] = (double)((long)local_30.m_data[0] + 0x30);
      local_b0[1] = 1.48219693752374e-323;
      local_90 = 6;
      local_80 = local_30.m_data[1];
      local_98 = &local_30;
      if (8 < (long)local_30.m_data[1]) {
        ChVector<double>::
        ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                  (&local_48,
                   (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                    *)local_b0,(type *)0x0);
        auVar4._8_8_ = uStack_70;
        auVar4._0_8_ = local_78;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_58;
        auVar6 = vbroadcastsd_avx512f(auVar2);
        auVar6 = vpermi2pd_avx512f(_DAT_00972200,ZEXT2464(CONCAT816(auVar6._16_8_,local_68)),
                                   ZEXT1664(CONCAT88(local_c8.m_data[1],local_c8.m_data[0])));
        dVar1 = (this->m_rzz).m_data[2];
        auVar7 = vbroadcastsd_avx512f(auVar4);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_c8.m_data[2];
        auVar8 = vbroadcastsd_avx512f(auVar3);
        auVar9._0_40_ = auVar6._0_40_;
        auVar9._40_8_ = auVar8._40_8_;
        auVar9._48_8_ = auVar6._48_8_;
        auVar9._56_8_ = auVar6._56_8_;
        auVar5._8_8_ = local_48.m_data[1];
        auVar5._0_8_ = local_48.m_data[0];
        auVar6 = vinsertf32x4_avx512f(auVar9,auVar5,3);
        auVar6 = vmulpd_avx512f(auVar6,auVar7);
        auVar6 = vaddpd_avx512f(auVar6,*(undefined1 (*) [64])&(this->super_ChNodeFEAbase).field_0x20
                               );
        *(undefined1 (*) [64])&(this->super_ChNodeFEAbase).field_0x20 = auVar6;
        (this->m_rzz).m_data[2] = local_78 * local_48.m_data[2] + dVar1;
        return;
      }
    }
  }
  local_b0[1] = 1.48219693752374e-323;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAcurv::VariablesQbIncrementPosition(double step) {
    ChVector<> new_rxx_dt(m_variables->Get_qb().segment(0, 3));
    ChVector<> new_ryy_dt(m_variables->Get_qb().segment(3, 3));
    ChVector<> new_rzz_dt(m_variables->Get_qb().segment(6, 3));
    m_rxx = m_rxx + new_rxx_dt * step;
    m_ryy = m_ryy + new_ryy_dt * step;
    m_rzz = m_rzz + new_rzz_dt * step;
}